

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t hufBuildDecTable(uint64_t *hcode,uint32_t im,uint32_t iM,HufDec *hdecod)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  HufDec *pHVar8;
  uint32_t *p;
  
  if (iM < im) {
    return 0;
  }
  uVar6 = (ulong)im;
  do {
    uVar5 = hcode[uVar6];
    uVar7 = uVar5 >> 6;
    if (uVar7 >> ((byte)uVar5 & 0x3f) != 0) {
      return 0x17;
    }
    uVar4 = (uint)uVar5 & 0x3f;
    if (uVar4 < 0xf) {
      if ((uVar5 & 0x3f) != 0) {
        bVar3 = 0xe - (char)uVar4;
        pHVar8 = hdecod + (uVar7 << (bVar3 & 0x3f));
        uVar5 = (ulong)(uint)(1 << (bVar3 & 0x1f));
        do {
          if (pHVar8->len != 0) {
            return 0x17;
          }
          if (pHVar8->p != (uint32_t *)0x0) {
            return 0x17;
          }
          pHVar8->len = uVar4;
          pHVar8->lit = (uint32_t)uVar6;
          pHVar8 = pHVar8 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
    else {
      uVar7 = uVar7 >> ((char)uVar4 - 0xeU & 0x3f);
      if (hdecod[uVar7].len != 0) {
        return 0x17;
      }
      uVar4 = hdecod[uVar7].lit + 1;
      hdecod[uVar7].lit = uVar4;
      puVar2 = hdecod[uVar7].p;
      if (puVar2 == (uint32_t *)0x0) {
        puVar2 = (uint32_t *)internal_exr_alloc(4);
        hdecod[uVar7].p = puVar2;
      }
      else {
        puVar1 = (uint32_t *)internal_exr_alloc((ulong)uVar4 << 2);
        hdecod[uVar7].p = puVar1;
        if ((puVar1 != (uint32_t *)0x0) && (uVar4 = hdecod[uVar7].lit - 1, uVar4 != 0)) {
          uVar5 = 0;
          do {
            puVar1[uVar5] = puVar2[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        internal_exr_free(puVar2);
        puVar2 = hdecod[uVar7].p;
      }
      if (puVar2 == (uint32_t *)0x0) {
        return 1;
      }
      puVar2[hdecod[uVar7].lit - 1] = (uint32_t)uVar6;
    }
    uVar6 = uVar6 + 1;
    if (iM + 1 == (int)uVar6) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
hufBuildDecTable (
    const uint64_t* hcode, uint32_t im, uint32_t iM, HufDec* hdecod)
{
    //
    // Init hashtable & loop on all codes.
    // Assumes that hufClearDecTable(hdecod) has already been called.
    //

    for (; im <= iM; im++)
    {
        uint64_t c = hufCode (hcode[im]);
        int      l = hufLength (hcode[im]);

        if (c >> l)
        {
            //
            // Error: c is supposed to be an l-bit code,
            // but c contains a value that is greater
            // than the largest l-bit number.
            //

            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (l > HUF_DECBITS)
        {
            //
            // Long code: add a secondary entry
            //

            HufDec* pl = hdecod + (c >> (l - HUF_DECBITS));

            if (pl->len)
            {
                //
                // Error: a short code has already
                // been stored in table entry *pl.
                //

                return EXR_ERR_CORRUPT_CHUNK;
            }

            pl->lit++;

            if (pl->p)
            {
                uint32_t* p = pl->p;
                pl->p       = (uint32_t*) internal_exr_alloc (
                    sizeof (uint32_t) * pl->lit);

                if (pl->p)
                {
                    for (uint32_t i = 0; i < pl->lit - 1; ++i)
                        pl->p[i] = p[i];
                }

                internal_exr_free (p);
            }
            else { pl->p = (uint32_t*) internal_exr_alloc (sizeof (uint32_t)); }

            if (!pl->p) return EXR_ERR_OUT_OF_MEMORY;

            pl->p[pl->lit - 1] = im;
        }
        else if (l)
        {
            //
            // Short code: init all primary entries
            //

            HufDec* pl = hdecod + (c << (HUF_DECBITS - l));

            for (uint64_t i = 1 << (HUF_DECBITS - l); i > 0; i--, pl++)
            {
                if (pl->len || pl->p)
                {
                    //
                    // Error: a short code or a long code has
                    // already been stored in table entry *pl.
                    //

                    return EXR_ERR_CORRUPT_CHUNK;
                }

                pl->len = (int32_t) l;
                pl->lit = im;
            }
        }
    }
    return EXR_ERR_SUCCESS;
}